

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_collector.cpp
# Opt level: O3

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::PhysicalBufferedCollector::GetResult(PhysicalBufferedCollector *this,GlobalSinkState *state)

{
  int iVar1;
  ClientContext *this_00;
  long in_RDX;
  shared_ptr<duckdb::ClientContext,_true> cc;
  _func_int **local_68;
  shared_ptr<duckdb::ClientContext,_true> local_60;
  ClientProperties local_50;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(in_RDX + 0x58));
  if (iVar1 == 0) {
    weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)&local_60);
    this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->(&local_60);
    ClientContext::GetClientProperties(&local_50,this_00);
    make_uniq<duckdb::StreamQueryResult,duckdb::StatementType&,duckdb::StatementProperties&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb::ClientProperties,duckdb::shared_ptr<duckdb::BufferedData,true>&>
              ((duckdb *)&local_68,
               (StatementType *)
               (state[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size +
               0x18),(StatementProperties *)
                     &state[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data
                      .__list.__next,
               (vector<duckdb::LogicalType,_true> *)
               &(state->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex.__data.
                __list,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&state[3].super_StateWithBlockableTasks.lock,&local_50,
               (shared_ptr<duckdb::BufferedData,_true> *)(in_RDX + 0x90));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.time_zone._M_dataplus._M_p != &local_50.time_zone.field_2) {
      operator_delete(local_50.time_zone._M_dataplus._M_p);
    }
    (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator = local_68;
    if (local_60.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.internal.
                 super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RDX + 0x58));
    return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
           (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

unique_ptr<QueryResult> PhysicalBufferedCollector::GetResult(GlobalSinkState &state) {
	auto &gstate = state.Cast<BufferedCollectorGlobalState>();
	lock_guard<mutex> l(gstate.glock);
	// FIXME: maybe we want to check if the execution was successful before creating the StreamQueryResult ?
	auto cc = gstate.context.lock();
	auto result = make_uniq<StreamQueryResult>(statement_type, properties, types, names, cc->GetClientProperties(),
	                                           gstate.buffered_data);
	return std::move(result);
}